

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

void ft_stroke_border_close(FT_StrokeBorder border,FT_Bool reverse)

{
  uint uVar1;
  FT_Byte FVar2;
  uint uVar3;
  uint uVar4;
  FT_Vector *pFVar5;
  FT_Vector *pFVar6;
  FT_Pos FVar7;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Byte *pFVar10;
  FT_Vector *pFVar11;
  FT_Byte *pFVar12;
  FT_Vector *pFVar13;
  FT_Vector tmp;
  
  uVar3 = border->num_points;
  uVar4 = border->start;
  if (uVar4 + 1 < uVar3) {
    uVar1 = uVar3 - 1;
    border->num_points = uVar1;
    pFVar5 = border->points + uVar1;
    FVar7 = pFVar5->y;
    pFVar6 = border->points + uVar4;
    pFVar6->x = pFVar5->x;
    pFVar6->y = FVar7;
    if (reverse != '\0') {
      pFVar5 = border->points + uVar4;
      pFVar6 = border->points + uVar1;
      while( true ) {
        pFVar13 = pFVar6 + -1;
        pFVar11 = pFVar5 + 1;
        if (pFVar13 <= pFVar11) break;
        FVar7 = pFVar11->x;
        FVar8 = pFVar5[1].y;
        FVar9 = pFVar6[-1].y;
        pFVar11->x = pFVar13->x;
        pFVar5[1].y = FVar9;
        pFVar13->x = FVar7;
        pFVar6[-1].y = FVar8;
        pFVar5 = pFVar11;
        pFVar6 = pFVar13;
      }
      pFVar12 = border->tags + uVar4;
      pFVar10 = border->tags + uVar1;
      while( true ) {
        pFVar10 = pFVar10 + -1;
        pFVar12 = pFVar12 + 1;
        if (pFVar10 <= pFVar12) break;
        FVar2 = *pFVar12;
        *pFVar12 = *pFVar10;
        *pFVar10 = FVar2;
      }
    }
    border->tags[uVar4] = border->tags[uVar4] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar4;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void
  ft_stroke_border_close( FT_StrokeBorder  border,
                          FT_Bool          reverse )
  {
    FT_UInt  start = (FT_UInt)border->start;
    FT_UInt  count = border->num_points;


    FT_ASSERT( border->start >= 0 );

    /* don't record empty paths! */
    if ( count <= start + 1U )
      border->num_points = start;
    else
    {
      /* copy the last point to the start of this sub-path, since */
      /* it contains the `adjusted' starting coordinates          */
      border->num_points    = --count;
      border->points[start] = border->points[count];

      if ( reverse )
      {
        /* reverse the points */
        {
          FT_Vector*  vec1 = border->points + start + 1;
          FT_Vector*  vec2 = border->points + count - 1;


          for ( ; vec1 < vec2; vec1++, vec2-- )
          {
            FT_Vector  tmp;


            tmp   = *vec1;
            *vec1 = *vec2;
            *vec2 = tmp;
          }
        }

        /* then the tags */
        {
          FT_Byte*  tag1 = border->tags + start + 1;
          FT_Byte*  tag2 = border->tags + count - 1;


          for ( ; tag1 < tag2; tag1++, tag2-- )
          {
            FT_Byte  tmp;


            tmp   = *tag1;
            *tag1 = *tag2;
            *tag2 = tmp;
          }
        }
      }

      border->tags[start    ] |= FT_STROKE_TAG_BEGIN;
      border->tags[count - 1] |= FT_STROKE_TAG_END;
    }

    border->start   = -1;
    border->movable = FALSE;
  }